

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O3

void lsvm::hashmap::reshuffle_partition(hashmap *h,uint16_t bit)

{
  uint32_t *puVar1;
  int iVar2;
  hashbucket *phVar3;
  hashbucket *phVar4;
  hashbucket *phVar5;
  ushort bit_00;
  hashbucket *pb;
  undefined6 in_register_00000032;
  hashbucket *b;
  hashbucket *phVar6;
  
  pb = (hashbucket *)(&h[1].equals + (CONCAT62(in_register_00000032,bit) & 0xffffffff));
  phVar3 = pb->next;
  phVar6 = pb;
  while (phVar5 = phVar6, phVar3 != (hashbucket *)0x0) {
    iVar2 = (&primes)[phVar3->bucket_size_indx];
    phVar6 = phVar3 + 1;
    do {
      if (*(void **)&phVar6->count != (void *)0x0) {
        bit_00 = h->bits & (ushort)phVar6->next;
        if (bit_00 != bit) {
          insert_into_partition
                    (h,(hash)phVar6->next,bit_00,*(void **)&phVar6->count,phVar6[1].next,false);
          phVar4 = phVar5->next;
          phVar6->next = (hashbucket_t *)0x0;
          phVar6->count = 0;
          phVar6->bucket_size_indx = 0;
          phVar6[1].next = (hashbucket_t *)0x0;
          puVar1 = &phVar4->count;
          *puVar1 = *puVar1 - 1;
          h->count = h->count - 1;
        }
      }
      phVar6 = (hashbucket *)&phVar6[1].count;
    } while (phVar6 <= (undefined1 *)((long)phVar3 + (ulong)(iVar2 - 1) * 0x18 + 0x10));
    phVar6 = phVar5->next;
    phVar3 = phVar6->next;
    if (phVar6->count == 0) {
      memory::retain(phVar6);
      phVar5->next = phVar3;
      phVar6 = phVar5;
    }
  }
  balance_partition((hashbucket **)pb);
  return;
}

Assistant:

inline hashbucket** partition(hashmap* h, uint16_t bit) { return buckets(h)+bit; }